

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_stop_sync(MppSThd thd)

{
  char *pcVar1;
  char *pcVar2;
  void *local_28;
  void *dummy;
  MppSThdImpl *pMStack_18;
  MppSThdStatus status;
  MppSThdImpl *impl;
  MppSThd thd_local;
  
  pMStack_18 = (MppSThdImpl *)thd;
  impl = (MppSThdImpl *)thd;
  check_sthd("mpp_sthd_stop_sync",(MppSThdImpl *)thd);
  pthread_mutex_lock((pthread_mutex_t *)&pMStack_18->lock);
  dummy._4_4_ = pMStack_18->status;
  if (dummy._4_4_ == MPP_STHD_STOPPING) {
    pthread_join(pMStack_18->thd,&local_28);
    pMStack_18->status = MPP_STHD_READY;
  }
  else {
    pcVar1 = pMStack_18->name;
    pcVar2 = state2str(dummy._4_4_);
    _mpp_log_l(2,"mpp_thread","%s can NOT stop on %s\n",(char *)0x0,pcVar1,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pMStack_18->lock);
  check_sthd("mpp_sthd_stop_sync",pMStack_18);
  return;
}

Assistant:

void mpp_sthd_stop_sync(MppSThd thd)
{
    MppSThdImpl *impl = (MppSThdImpl *)thd;
    MppSThdStatus status;

    CHECK_STHD(impl);

    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_STOPPING : {
        void *dummy;

        pthread_join(impl->thd, &dummy);
        impl->status = MPP_STHD_READY;
    } break;
    default : {
        mpp_err("%s can NOT stop on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);

    CHECK_STHD(impl);
}